

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowingList(void)

{
  char *pcVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow **ppIVar4;
  char *pcVar5;
  ImVec2 local_58;
  char *local_50;
  char *label;
  ImGuiWindow *window;
  ImVec2 IStack_38;
  int n;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x221f,"void ImGui::NavUpdateWindowingList()");
  }
  if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
    if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
      pIVar3 = FindWindowByName("###NavWindowingList");
      local_10->NavWindowingList = pIVar3;
    }
    ImVec2::ImVec2(&local_18,(local_10->IO).DisplaySize.x * 0.2,(local_10->IO).DisplaySize.y * 0.2);
    ImVec2::ImVec2(&local_20,3.4028235e+38,3.4028235e+38);
    SetNextWindowSizeConstraints(&local_18,&local_20,(ImGuiSizeCallback)0x0,(void *)0x0);
    local_28 = operator*(&(local_10->IO).DisplaySize,0.5);
    ImVec2::ImVec2(&local_30,0.5,0.5);
    SetNextWindowPos(&local_28,1,&local_30);
    IStack_38 = operator*(&(local_10->Style).WindowPadding,2.0);
    PushStyleVar(1,&stack0xffffffffffffffc8);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    window._4_4_ = (local_10->WindowsFocusOrder).Size;
    while (window._4_4_ = window._4_4_ + -1, -1 < window._4_4_) {
      ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&local_10->WindowsFocusOrder,window._4_4_);
      label = (char *)*ppIVar4;
      bVar2 = IsWindowNavFocusable((ImGuiWindow *)label);
      if (bVar2) {
        pcVar1 = *(char **)label;
        local_50 = pcVar1;
        pcVar5 = FindRenderedTextEnd(pcVar1,(char *)0x0);
        if (pcVar1 == pcVar5) {
          local_50 = GetFallbackWindowNameForWindowingList((ImGuiWindow *)label);
        }
        pcVar1 = local_50;
        bVar2 = local_10->NavWindowingTarget == (ImGuiWindow *)label;
        ImVec2::ImVec2(&local_58,0.0,0.0);
        Selectable(pcVar1,bVar2,0,&local_58);
      }
    }
    End();
    PopStyleVar(1);
  }
  return;
}

Assistant:

void ImGui::NavUpdateWindowingList()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget != NULL);

    if (g.NavWindowingTimer < NAV_WINDOWING_LIST_APPEAR_DELAY)
        return;

    if (g.NavWindowingList == NULL)
        g.NavWindowingList = FindWindowByName("###NavWindowingList");
    SetNextWindowSizeConstraints(ImVec2(g.IO.DisplaySize.x * 0.20f, g.IO.DisplaySize.y * 0.20f), ImVec2(FLT_MAX, FLT_MAX));
    SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Always, ImVec2(0.5f, 0.5f));
    PushStyleVar(ImGuiStyleVar_WindowPadding, g.Style.WindowPadding * 2.0f);
    Begin("###NavWindowingList", NULL, ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings);
    for (int n = g.WindowsFocusOrder.Size - 1; n >= 0; n--)
    {
        ImGuiWindow* window = g.WindowsFocusOrder[n];
        if (!IsWindowNavFocusable(window))
            continue;
        const char* label = window->Name;
        if (label == FindRenderedTextEnd(label))
            label = GetFallbackWindowNameForWindowingList(window);
        Selectable(label, g.NavWindowingTarget == window);
    }
    End();
    PopStyleVar();
}